

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O3

sljit_label * sljit_emit_label(sljit_compiler *compiler)

{
  sljit_label *psVar1;
  undefined2 *puVar2;
  sljit_label *psVar3;
  
  if (compiler->error == 0) {
    psVar1 = compiler->last_label;
    if ((psVar1 != (sljit_label *)0x0) && (psVar1->size == compiler->size)) {
      return psVar1;
    }
    psVar1 = (sljit_label *)ensure_abuf(compiler,0x18);
    if (psVar1 != (sljit_label *)0x0) {
      psVar1->next = (sljit_label *)0x0;
      psVar1->size = compiler->size;
      psVar3 = (sljit_label *)&compiler->labels;
      if (compiler->last_label != (sljit_label *)0x0) {
        psVar3 = compiler->last_label;
      }
      psVar3->next = psVar1;
      compiler->last_label = psVar1;
      puVar2 = (undefined2 *)ensure_buf(compiler,2);
      if (puVar2 != (undefined2 *)0x0) {
        *puVar2 = 0;
        return psVar1;
      }
    }
  }
  return (sljit_label *)0x0;
}

Assistant:

sljit_label* sljit_emit_label(struct sljit_compiler *compiler)
{
	sljit_u8 *inst;
	struct sljit_label *label;

	CHECK_ERROR_PTR();
	CHECK_PTR(check_sljit_emit_label(compiler));

	if (compiler->last_label && compiler->last_label->size == compiler->size)
		return compiler->last_label;

	label = (struct sljit_label*)ensure_abuf(compiler, sizeof(struct sljit_label));
	PTR_FAIL_IF(!label);
	set_label(label, compiler);

	inst = (sljit_u8*)ensure_buf(compiler, 2);
	PTR_FAIL_IF(!inst);

	*inst++ = 0;
	*inst++ = 0;

	return label;
}